

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  TestCase *pTVar5;
  int width;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  TimeInMillis ms;
  int i;
  allocator<char> local_2e9;
  tm time_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string kIndent;
  string kTestsuites;
  int local_24c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestsuites,"testsuites",(allocator<char> *)&time_struct);
  Indent_abi_cxx11_(&kIndent,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"tests",(allocator<char> *)&local_2b0);
  iVar2 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar2,&kIndent,true);
  std::__cxx11::string::~string((string *)&time_struct);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"failures",(allocator<char> *)&local_2b0);
  iVar2 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar2,&kIndent,true);
  std::__cxx11::string::~string((string *)&time_struct);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"disabled",(allocator<char> *)&local_2b0);
  iVar2 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar2,&kIndent,true);
  std::__cxx11::string::~string((string *)&time_struct);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"errors",(allocator<char> *)&local_2b0);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,0,&kIndent,true);
  std::__cxx11::string::~string((string *)&time_struct);
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&time_struct,"random_seed",(allocator<char> *)&local_2b0);
    OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,unit_test->impl_->random_seed_,&kIndent
                  ,true);
    std::__cxx11::string::~string((string *)&time_struct);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"timestamp",&local_2e9);
  bVar1 = PortableLocaltime(unit_test->impl_->start_timestamp_ / 1000,&time_struct);
  if (bVar1) {
    local_24c = time_struct.tm_year + 0x76c;
    StreamableToString<int>(&local_128,&local_24c);
    std::operator+(&local_108,&local_128,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_148,(String *)(ulong)(time_struct.tm_mon + 1),value);
    std::operator+(&local_e8,&local_108,&local_148);
    std::operator+(&local_c8,&local_e8,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_168,(String *)(ulong)(uint)time_struct.tm_mday,value_00);
    std::operator+(&local_a8,&local_c8,&local_168);
    std::operator+(&local_88,&local_a8,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_188,(String *)(ulong)(uint)time_struct.tm_hour,value_01);
    std::operator+(&local_68,&local_88,&local_188);
    std::operator+(&local_48,&local_68,":");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1a8,(String *)(ulong)(uint)time_struct.tm_min,value_02);
    std::operator+(&local_208,&local_48,&local_1a8);
    std::operator+(&local_248,&local_208,":");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1c8,(String *)(ulong)(uint)time_struct.tm_sec,value_03);
    std::operator+(&local_2b0,&local_248,&local_1c8);
    std::operator+(&local_228,&local_2b0,"Z");
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"",(allocator<char> *)&local_2b0);
  }
  OutputJsonKey(stream,&kTestsuites,&local_1e8,&local_228,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"time",(allocator<char> *)&local_248);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_2b0,(internal *)unit_test->impl_->elapsed_time_,ms)
  ;
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,&local_2b0,&kIndent,false);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&time_struct);
  TestPropertiesAsJson((string *)&time_struct,&unit_test->impl_->ad_hoc_test_result_,&kIndent);
  poVar4 = std::operator<<(stream,(string *)&time_struct);
  std::operator<<(poVar4,",\n");
  std::__cxx11::string::~string((string *)&time_struct);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"name",(allocator<char> *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"AllTests",(allocator<char> *)&local_208);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,&local_2b0,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&time_struct);
  poVar4 = std::operator<<(stream,(string *)&kIndent);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)&kTestsuites);
  std::operator<<(poVar4,"\": [\n");
  bVar1 = false;
  for (iVar2 = 0;
      iVar2 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(unit_test->impl_->test_cases_).
                                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar2 = iVar2 + 1
      ) {
    pTVar5 = UnitTest::GetTestCase(unit_test,iVar2);
    iVar3 = TestCase::reportable_test_count(pTVar5);
    if (0 < iVar3) {
      if (bVar1) {
        std::operator<<(stream,",\n");
      }
      pTVar5 = UnitTest::GetTestCase(unit_test,iVar2);
      bVar1 = true;
      PrintJsonTestCase(stream,pTVar5);
    }
  }
  poVar4 = std::operator<<(stream,"\n");
  poVar4 = std::operator<<(poVar4,(string *)&kIndent);
  poVar4 = std::operator<<(poVar4,"]\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuites);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}